

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

bool gpt_params_parse(int argc,char **argv,gpt_params *params)

{
  char *__s;
  size_type __len1;
  _Alloc_hider _Var1;
  int iVar2;
  size_t __len2;
  int *piVar3;
  long lVar4;
  undefined8 extraout_RAX;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  float fVar7;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  string arg;
  ifstream file;
  allocator<char> local_289;
  gpt_params *local_288;
  char *local_280;
  int local_274;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  string local_238 [7];
  undefined8 auStack_150 [36];
  
  if (1 < argc) {
    local_248 = &params->antiprompt;
    local_240 = &params->model;
    local_270.container = &params->prompt;
    iVar5 = 1;
    local_288 = params;
    local_274 = argc;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,argv[iVar5],(allocator<char> *)local_238);
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_268,"-s");
      if ((iVar2 == 0) ||
         (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_268,"--seed"), iVar2 == 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_238,argv[(long)iVar5 + 1],&local_289);
        _Var1._M_p = local_238[0]._M_dataplus._M_p;
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        *piVar3 = 0;
        lVar4 = strtol(_Var1._M_p,&local_280,10);
        if (local_280 == _Var1._M_p) {
          std::__throw_invalid_argument("stoi");
        }
        else if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
          if (*piVar3 == 0) {
            *piVar3 = iVar2;
          }
          local_288->seed = (int32_t)lVar4;
LAB_001116af:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
            operator_delete(local_238[0]._M_dataplus._M_p,
                            local_238[0].field_2._M_allocated_capacity + 1);
          }
          iVar5 = iVar5 + 1;
          goto LAB_001116d2;
        }
        std::__throw_out_of_range("stoi");
LAB_001119cb:
        std::__throw_out_of_range("stoi");
LAB_001119d7:
        std::__throw_invalid_argument("stoi");
LAB_001119e3:
        std::__throw_out_of_range("stoi");
LAB_001119ef:
        std::__throw_invalid_argument("stoi");
LAB_001119fb:
        pbVar6 = &local_268;
        iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(pbVar6,"-h");
        iVar2 = (int)pbVar6;
        if (iVar5 != 0) {
          pbVar6 = &local_268;
          iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(pbVar6,"--help");
          iVar2 = (int)pbVar6;
          if (iVar5 != 0) {
            gpt_params_parse();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
              operator_delete(local_238[0]._M_dataplus._M_p,
                              local_238[0].field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
            _Unwind_Resume(extraout_RAX);
          }
        }
        gpt_print_usage(iVar2,argv,local_288);
        exit(0);
      }
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_268,"-t");
      if ((iVar2 == 0) ||
         (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_268,"--threads"), iVar2 == 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_238,argv[(long)iVar5 + 1],&local_289);
        _Var1._M_p = local_238[0]._M_dataplus._M_p;
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        *piVar3 = 0;
        lVar4 = strtol(_Var1._M_p,&local_280,10);
        if (local_280 != _Var1._M_p) {
          if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
            if (*piVar3 == 0) {
              *piVar3 = iVar2;
            }
            local_288->n_threads = (int32_t)lVar4;
            goto LAB_001116af;
          }
          goto LAB_001119cb;
        }
        goto LAB_001119d7;
      }
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_268,"-p");
      if ((iVar2 == 0) ||
         (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_268,"--prompt"), iVar2 == 0)) {
        local_288->interactive_start = false;
        local_288->use_color = false;
        local_288->interactive = false;
        __s = argv[(long)iVar5 + 1];
        __len1 = (local_288->prompt)._M_string_length;
        __len2 = strlen(__s);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (local_270.container,0,__len1,__s,__len2);
        goto LAB_00111734;
      }
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_268,"-f");
      if ((iVar2 == 0) ||
         (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_268,"--file"), iVar2 == 0)) {
        local_288->interactive_start = false;
        local_288->use_color = false;
        local_288->interactive = false;
        std::ifstream::ifstream(local_238,argv[(long)iVar5 + 1],_S_in);
        __first._8_8_ = 0xffffffff;
        __first._M_sbuf =
             *(streambuf_type **)
              ((long)auStack_150 + *(long *)(local_238[0]._M_dataplus._M_p + -0x18));
        std::__copy_move<false,false,std::input_iterator_tag>::
        __copy_m<std::istreambuf_iterator<char,std::char_traits<char>>,std::back_insert_iterator<std::__cxx11::string>>
                  (__first,(istreambuf_iterator<char,_std::char_traits<char>_>)
                           (ZEXT816(0xffffffff) << 0x40),local_270);
        iVar5 = iVar5 + 1;
        std::ifstream::~ifstream(local_238);
        goto LAB_001116d2;
      }
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_268,"-n");
      if ((iVar2 == 0) ||
         (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_268,"--n_predict"), iVar2 == 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_238,argv[(long)iVar5 + 1],&local_289);
        _Var1._M_p = local_238[0]._M_dataplus._M_p;
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        *piVar3 = 0;
        lVar4 = strtol(_Var1._M_p,&local_280,10);
        if (local_280 != _Var1._M_p) {
          if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
            if (*piVar3 == 0) {
              *piVar3 = iVar2;
            }
            local_288->n_predict = (int32_t)lVar4;
            goto LAB_001116af;
          }
          goto LAB_001119e3;
        }
        goto LAB_001119ef;
      }
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_268,"--top_k");
      if (iVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_238,argv[(long)iVar5 + 1],(allocator<char> *)&local_280);
        iVar2 = std::__cxx11::stoi(local_238,(size_t *)0x0,10);
        local_288->top_k = iVar2;
LAB_00111863:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
          operator_delete(local_238[0]._M_dataplus._M_p,
                          local_238[0].field_2._M_allocated_capacity + 1);
        }
LAB_00111734:
        iVar5 = iVar5 + 1;
      }
      else {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_268,"-c");
        if ((iVar2 == 0) ||
           (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_268,"--ctx_size"), iVar2 == 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238,argv[(long)iVar5 + 1],(allocator<char> *)&local_280);
          iVar2 = std::__cxx11::stoi(local_238,(size_t *)0x0,10);
          local_288->n_ctx = iVar2;
          goto LAB_00111863;
        }
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_268,"--top_p");
        if (iVar2 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238,argv[(long)iVar5 + 1],(allocator<char> *)&local_280);
          fVar7 = std::__cxx11::stof(local_238,(size_t *)0x0);
          local_288->top_p = fVar7;
          goto LAB_00111863;
        }
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_268,"--temp");
        if (iVar2 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238,argv[(long)iVar5 + 1],(allocator<char> *)&local_280);
          fVar7 = std::__cxx11::stof(local_238,(size_t *)0x0);
          local_288->temp = fVar7;
          goto LAB_00111863;
        }
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_268,"--repeat_last_n");
        if (iVar2 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238,argv[(long)iVar5 + 1],(allocator<char> *)&local_280);
          iVar2 = std::__cxx11::stoi(local_238,(size_t *)0x0,10);
          local_288->repeat_last_n = iVar2;
          goto LAB_00111863;
        }
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_268,"--repeat_penalty");
        if (iVar2 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238,argv[(long)iVar5 + 1],(allocator<char> *)&local_280);
          fVar7 = std::__cxx11::stof(local_238,(size_t *)0x0);
          local_288->repeat_penalty = fVar7;
          goto LAB_00111863;
        }
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_268,"-b");
        if ((iVar2 == 0) ||
           (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_268,"--batch_size"), iVar2 == 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238,argv[(long)iVar5 + 1],(allocator<char> *)&local_280);
          iVar2 = std::__cxx11::stoi(local_238,(size_t *)0x0,10);
          local_288->n_batch = iVar2;
          goto LAB_00111863;
        }
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_268,"-m");
        if ((iVar2 == 0) ||
           (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_268,"--model"), iVar2 == 0)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (local_240,argv[(long)iVar5 + 1]);
          goto LAB_00111734;
        }
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_268,"-i");
        if ((iVar2 == 0) ||
           (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_268,"--interactive"), iVar2 == 0)) {
          local_288->interactive = true;
        }
        else {
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_268,"--interactive-start");
          if (iVar2 == 0) {
            local_288->interactive = true;
            local_288->interactive_start = true;
          }
          else {
            iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_268,"--color");
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_268,"-r");
              if ((iVar2 != 0) &&
                 (iVar2 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_268,"--reverse-prompt"), iVar2 != 0)) goto LAB_001119fb;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(local_248,argv[(long)iVar5 + 1]);
              goto LAB_00111734;
            }
            local_288->use_color = true;
          }
        }
      }
LAB_001116d2:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_274);
  }
  return true;
}

Assistant:

bool gpt_params_parse(int argc, char ** argv, gpt_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-s" || arg == "--seed") {
            params.seed = std::stoi(argv[++i]);
        } else if (arg == "-t" || arg == "--threads") {
            params.n_threads = std::stoi(argv[++i]);
        } else if (arg == "-p" || arg == "--prompt") {
            params.interactive = false;
            params.interactive_start = false;
            params.use_color = false;

            params.prompt = argv[++i];
        } else if (arg == "-f" || arg == "--file") {

            params.interactive = false;
            params.interactive_start = false;
            params.use_color = false;

            std::ifstream file(argv[++i]);

            std::copy(std::istreambuf_iterator<char>(file),
                    std::istreambuf_iterator<char>(),
                    back_inserter(params.prompt));
                
        } else if (arg == "-n" || arg == "--n_predict") {
            params.n_predict = std::stoi(argv[++i]);
        } else if (arg == "--top_k") {
            params.top_k = std::stoi(argv[++i]);
        } else if (arg == "-c" || arg == "--ctx_size") {
            params.n_ctx = std::stoi(argv[++i]);
        } else if (arg == "--top_p") {
            params.top_p = std::stof(argv[++i]);
        } else if (arg == "--temp") {
            params.temp = std::stof(argv[++i]);
        } else if (arg == "--repeat_last_n") {
            params.repeat_last_n = std::stoi(argv[++i]);
        } else if (arg == "--repeat_penalty") {
            params.repeat_penalty = std::stof(argv[++i]);
        } else if (arg == "-b" || arg == "--batch_size") {
            params.n_batch = std::stoi(argv[++i]);
        } else if (arg == "-m" || arg == "--model") {
            params.model = argv[++i];
        } else if (arg == "-i" || arg == "--interactive") {
            params.interactive = true;
        } else if (arg == "--interactive-start") {
            params.interactive = true;
            params.interactive_start = true;
        } else if (arg == "--color") {
            params.use_color = true;
        } else if (arg == "-r" || arg == "--reverse-prompt") {
            params.antiprompt = argv[++i];
        } else if (arg == "-h" || arg == "--help") {
            gpt_print_usage(argc, argv, params);
            exit(0);
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            gpt_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}